

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void Am_Connection::Handle_Sockets(fd_set *readfds)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  byte local_51;
  undefined1 local_30 [8];
  sockaddr_in sa;
  int temp_socket;
  socklen_t i;
  Connection_List_Ptr local_list;
  fd_set *readfds_local;
  
  if (num_sockets != 0) {
    for (_temp_socket = connection_list; _temp_socket != (Connection_List_Ptr)0x0;
        _temp_socket = _temp_socket->next) {
      bVar2 = Connected(_temp_socket->connection_ptr);
      if (bVar2) {
        iVar3 = Get_Socket(_temp_socket->connection_ptr);
        uVar1 = readfds->fds_bits[iVar3 / 0x40];
        iVar3 = Get_Socket(_temp_socket->connection_ptr);
        if ((uVar1 & 1L << ((byte)((long)iVar3 % 0x40) & 0x3f)) != 0) {
          Handle_Input(_temp_socket->connection_ptr);
        }
      }
    }
    if (((readfds->fds_bits[m_parent_socket / 0x40] &
         1L << ((byte)((long)m_parent_socket % 0x40) & 0x3f)) != 0) && (m_parent_socket != 0)) {
      _temp_socket = connection_list;
      while( true ) {
        local_51 = 0;
        if (_temp_socket != (Connection_List_Ptr)0x0) {
          bVar2 = Waiting(_temp_socket->connection_ptr);
          local_51 = bVar2 ^ 0xff;
        }
        if ((local_51 & 1) == 0) break;
        _temp_socket = _temp_socket->next;
      }
      if (_temp_socket == (Connection_List_Ptr)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "C:hs: remote connection received without receiving");
        poVar4 = std::operator<<(poVar4,"connection waiting\n");
        std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      }
      else {
        sa.sin_zero[4] = '\x10';
        sa.sin_zero[5] = '\0';
        sa.sin_zero[6] = '\0';
        sa.sin_zero[7] = '\0';
        sa.sin_zero._0_4_ =
             accept(m_parent_socket,(sockaddr *)local_30,(socklen_t *)(sa.sin_zero + 4));
        if ((int)sa.sin_zero._0_4_ < 0) {
          perror("accept");
        }
        else {
          Set_Socket(_temp_socket->connection_ptr,sa.sin_zero._0_4_);
          Set_Waiting_Flag(_temp_socket->connection_ptr,false);
          Set_Connect_Flag(_temp_socket->connection_ptr,true);
        }
      }
    }
  }
  return;
}

Assistant:

void
Am_Connection::Handle_Sockets(fd_set *readfds)
{
  if (!num_sockets)
    return;
  else {

    Connection_List_Ptr local_list;
    local_list = connection_list;
    ////
    //// Check Connections for incoming data
    ////
    while (local_list != nullptr) {
      if ((local_list->connection_ptr->Connected()) &&
          (FD_ISSET((local_list->connection_ptr->Get_Socket()), readfds))) {
        local_list->connection_ptr->Handle_Input();
      }
      local_list = local_list->next;
    }
    ////
    //// Check Parent socket for new connections
    ////
    /* This assumes that we don't need each side to specify the other.
 * The first waiting connection will get the first caller.
 * A better way might be to have the Handle sockets check the address of
 * the caller.
 */
    if ((FD_ISSET(m_parent_socket, readfds)) && (m_parent_socket != 0)) {
      local_list = connection_list;
      while ((local_list != nullptr) &&
             (!(local_list->connection_ptr->Waiting()))) {
        local_list = local_list->next;
      }
      if (local_list == nullptr)
        std::cerr << "C:hs: remote connection received without receiving"
                  << "connection waiting\n"
                  << std::flush;
      else {
        socklen_t i;
        int temp_socket;
        struct sockaddr_in sa;
        i = sizeof(sa);
        if ((temp_socket =
                 accept(m_parent_socket, (struct sockaddr *)&sa, &i)) < 0) {
          perror("accept");
        } else {
          local_list->connection_ptr->Set_Socket(temp_socket);
          local_list->connection_ptr->Set_Waiting_Flag(false);
          local_list->connection_ptr->Set_Connect_Flag(true);
        }

      } // Found new connection
    }   // someone trying to connect to parent
  }     // There is at least 1 connection
}